

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reporter.cc
# Opt level: O0

void __thiscall benchmark::CSVReporter::PrintRunData(CSVReporter *this,Run *run)

{
  ostream *poVar1;
  size_type sVar2;
  char *pcVar3;
  ulong uVar4;
  string *in_RSI;
  BenchmarkReporter *in_RDI;
  double dVar5;
  string label;
  string msg;
  string name;
  ostream *Out;
  Run *in_stack_fffffffffffffd90;
  string *to;
  string *in_stack_fffffffffffffd98;
  string *psVar6;
  string *in_stack_fffffffffffffda0;
  BigO complexity;
  undefined1 local_1b9 [40];
  undefined1 local_191 [33];
  string local_170 [32];
  string local_150 [32];
  undefined4 local_130;
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [32];
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  string local_38 [32];
  string *local_18;
  string *local_10;
  
  local_10 = in_RSI;
  local_18 = (string *)BenchmarkReporter::GetOutputStream(in_RDI);
  std::__cxx11::string::string(local_38,local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"\"",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"\"\"",&local_91);
  ReplaceAll(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             &in_stack_fffffffffffffd90->benchmark_name);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  poVar1 = std::operator<<((ostream *)local_18,'\"');
  poVar1 = std::operator<<(poVar1,local_38);
  std::operator<<(poVar1,"\",");
  psVar6 = local_18;
  if (((byte)local_10[0x40] & 1) == 0) {
    if ((((byte)local_10[0xb4] & 1) == 0) && (((byte)local_10[0xb5] & 1) == 0)) {
      std::ostream::operator<<(local_18,*(long *)(local_10 + 0x68));
    }
    std::operator<<((ostream *)local_18,",");
    psVar6 = local_18;
    dVar5 = BenchmarkReporter::Run::GetAdjustedRealTime(in_stack_fffffffffffffd90);
    poVar1 = (ostream *)std::ostream::operator<<(psVar6,dVar5);
    complexity = (BigO)((ulong)psVar6 >> 0x20);
    std::operator<<(poVar1,",");
    psVar6 = local_18;
    dVar5 = BenchmarkReporter::Run::GetAdjustedCPUTime(in_stack_fffffffffffffd90);
    poVar1 = (ostream *)std::ostream::operator<<(psVar6,dVar5);
    std::operator<<(poVar1,",");
    psVar6 = local_18;
    if (((byte)local_10[0xb4] & 1) == 0) {
      if (((byte)local_10[0xb5] & 1) == 0) {
        in_stack_fffffffffffffda0 = local_18;
        pcVar3 = GetTimeUnitString(*(TimeUnit *)(local_10 + 0x70));
        std::operator<<((ostream *)in_stack_fffffffffffffda0,pcVar3);
      }
    }
    else {
      GetBigOString_abi_cxx11_(complexity);
      std::operator<<((ostream *)psVar6,local_150);
      std::__cxx11::string::~string(local_150);
    }
    std::operator<<((ostream *)local_18,",");
    if (0.0 < *(double *)(local_10 + 0x88)) {
      std::ostream::operator<<(local_18,*(double *)(local_10 + 0x88));
    }
    std::operator<<((ostream *)local_18,",");
    if (0.0 < *(double *)(local_10 + 0x90)) {
      std::ostream::operator<<(local_18,*(double *)(local_10 + 0x90));
    }
    std::operator<<((ostream *)local_18,",");
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::string(local_170,local_10 + 0x20);
      psVar6 = (string *)local_191;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_191 + 1),"\"",(allocator *)psVar6);
      to = (string *)local_1b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_1b9 + 1),"\"\"",(allocator *)to);
      ReplaceAll(in_stack_fffffffffffffda0,psVar6,to);
      std::__cxx11::string::~string((string *)(local_1b9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1b9);
      std::__cxx11::string::~string((string *)(local_191 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_191);
      poVar1 = std::operator<<((ostream *)local_18,"\"");
      poVar1 = std::operator<<(poVar1,local_170);
      std::operator<<(poVar1,"\"");
      std::__cxx11::string::~string(local_170);
    }
    std::operator<<((ostream *)local_18,",,");
    std::operator<<((ostream *)local_18,'\n');
    local_130 = 0;
  }
  else {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(anonymous_namespace)::elements_abi_cxx11_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,sVar2 - 3,',',&local_b9);
    std::operator<<((ostream *)psVar6,local_b8);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::operator<<((ostream *)local_18,"true,");
    std::__cxx11::string::string(local_e0,local_10 + 0x48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"\"",&local_101);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"\"\"",&local_129);
    ReplaceAll(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               &in_stack_fffffffffffffd90->benchmark_name);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    poVar1 = std::operator<<((ostream *)local_18,'\"');
    poVar1 = std::operator<<(poVar1,local_e0);
    std::operator<<(poVar1,"\"\n");
    local_130 = 1;
    std::__cxx11::string::~string(local_e0);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void CSVReporter::PrintRunData(const Run & run) {
  std::ostream& Out = GetOutputStream();

  // Field with embedded double-quote characters must be doubled and the field
  // delimited with double-quotes.
  std::string name = run.benchmark_name;
  ReplaceAll(&name, "\"", "\"\"");
  Out << '"' << name << "\",";
  if (run.error_occurred) {
    Out << std::string(elements.size() - 3, ',');
    Out << "true,";
    std::string msg = run.error_message;
    ReplaceAll(&msg, "\"", "\"\"");
    Out << '"' << msg << "\"\n";
    return;
  }

  // Do not print iteration on bigO and RMS report
  if (!run.report_big_o && !run.report_rms) {
    Out << run.iterations;
  }
  Out << ",";

  Out << run.GetAdjustedRealTime() << ",";
  Out << run.GetAdjustedCPUTime() << ",";

  // Do not print timeLabel on bigO and RMS report
  if (run.report_big_o) {
    Out << GetBigOString(run.complexity);
  } else if (!run.report_rms) {
    Out << GetTimeUnitString(run.time_unit);
  }
  Out << ",";

  if (run.bytes_per_second > 0.0) {
    Out << run.bytes_per_second;
  }
  Out << ",";
  if (run.items_per_second > 0.0) {
    Out << run.items_per_second;
  }
  Out << ",";
  if (!run.report_label.empty()) {
    // Field with embedded double-quote characters must be doubled and the field
    // delimited with double-quotes.
    std::string label = run.report_label;
    ReplaceAll(&label, "\"", "\"\"");
    Out << "\"" << label << "\"";
  }
  Out << ",,";  // for error_occurred and error_message
  Out << '\n';
}